

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# progressbar.cpp
# Opt level: O0

void __thiscall
QtMWidgets::ProgressBarPrivate::ProgressBarPrivate(ProgressBarPrivate *this,ProgressBar *parent)

{
  ProgressBar *parent_local;
  ProgressBarPrivate *this_local;
  
  this->q = parent;
  this->minimum = 0;
  this->maximum = 0;
  this->value = -1;
  this->lastPaintedValue = -1;
  this->orientation = Horizontal;
  this->invertedAppearance = false;
  this->grooveHeight = 3;
  QColor::QColor(&this->highlightColor);
  QColor::QColor(&this->grooveColor);
  QColor::QColor(&this->animationColor);
  this->animation = (QVariantAnimation *)0x0;
  this->animate = true;
  return;
}

Assistant:

ProgressBarPrivate( ProgressBar * parent )
		:	q( parent )
		,	minimum( 0 )
		,	maximum( 0 )
		,	value( -1 )
		,	lastPaintedValue( -1 )
		,	orientation( Qt::Horizontal )
		,	invertedAppearance( false )
		,	grooveHeight( 3 )
		,	animation( 0 )
		,	animate( true )
	{
	}